

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O2

int __thiscall gl3cts::GL33TestPackage::init(GL33TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  GL32TestPackage::init(&this->super_GL32TestPackage,ctx);
  pTVar1 = (TestNode *)operator_new(0x78);
  GL33ShaderTests::GL33ShaderTests
            ((GL33ShaderTests *)pTVar1,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  glcts::PipelineStatisticsQueryTests::PipelineStatisticsQueryTests
            ((PipelineStatisticsQueryTests *)pTVar1,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  glcts::CullDistance::Tests::Tests
            ((Tests *)pTVar1,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureSwizzleTests::TextureSwizzleTests
            ((TextureSwizzleTests *)pTVar1,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL33TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL32TestPackage::init();

	try
	{
		addChild(new GL33ShaderTests(getContext()));
		addChild(new glcts::PipelineStatisticsQueryTests(getContext()));
		addChild(new glcts::CullDistance::Tests(getContext()));
		addChild(new gl3cts::TextureSwizzleTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}